

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupMux(int iVar,Gia_Man_t *pCof1,Gia_Man_t *pCof0)

{
  uint iCtrl;
  int iVar1;
  int iVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  uint local_7c;
  int Lit0;
  int Lit1;
  int Ctrl;
  int n;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *pGia [2];
  Gia_Man_t *pCof0_local;
  Gia_Man_t *pCof1_local;
  int iVar_local;
  
  pGia[0] = pCof1;
  iVar1 = Gia_ManRegNum(pCof0);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(pCof0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x666,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManRegNum(pCof1);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(pCof1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x667,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManCoNum(pCof0);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManCoNum(pCof0) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x668,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManCoNum(pCof1);
  if (iVar1 == 1) {
    iVar1 = Gia_ManCiNum(pCof1);
    iVar2 = Gia_ManCiNum(pCof0);
    if (iVar1 != iVar2) {
      __assert_fail("Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0x66a,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
    }
    if (-1 < iVar) {
      iVar1 = Gia_ManCiNum(pCof1);
      if (iVar < iVar1) {
        iVar1 = Gia_ManObjNum(pCof1);
        iVar2 = Gia_ManObjNum(pCof0);
        p = Gia_ManStart(iVar1 + iVar2);
        pcVar3 = Abc_UtilStrsav(pCof1->pName);
        p->pName = pcVar3;
        pcVar3 = Abc_UtilStrsav(pCof1->pSpec);
        p->pSpec = pcVar3;
        Gia_ManHashAlloc(p);
        for (Lit1 = 0; Lit1 < 2; Lit1 = Lit1 + 1) {
          Gia_ManFillValue(pGia[(long)Lit1 + -1]);
          pGVar4 = Gia_ManConst0(pGia[(long)Lit1 + -1]);
          pGVar4->Value = 0;
          Ctrl = 0;
          while( true ) {
            iVar1 = Vec_IntSize(pGia[(long)Lit1 + -1]->vCis);
            bVar6 = false;
            if (Ctrl < iVar1) {
              _n = Gia_ManCi(pGia[(long)Lit1 + -1],Ctrl);
              bVar6 = _n != (Gia_Obj_t *)0x0;
            }
            if (!bVar6) break;
            if (Lit1 == 0) {
              local_7c = Gia_ManAppendCi(p);
            }
            else {
              pGVar4 = Gia_ManCi(pCof0,Ctrl);
              local_7c = pGVar4->Value;
            }
            _n->Value = local_7c;
            Ctrl = Ctrl + 1;
          }
          Ctrl = 0;
          while( true ) {
            iVar1 = Vec_IntSize(pGia[(long)Lit1 + -1]->vCos);
            bVar6 = false;
            if (Ctrl < iVar1) {
              _n = Gia_ManCo(pGia[(long)Lit1 + -1],Ctrl);
              bVar6 = _n != (Gia_Obj_t *)0x0;
            }
            if (!bVar6) break;
            pGVar5 = pGia[(long)Lit1 + -1];
            pGVar4 = Gia_ObjFanin0(_n);
            Gia_ManDupCofactorVar_rec(p,pGVar5,pGVar4);
            Ctrl = Ctrl + 1;
          }
        }
        Ctrl = 0;
        while( true ) {
          iVar1 = Vec_IntSize(pCof0->vCos);
          bVar6 = false;
          if (Ctrl < iVar1) {
            _n = Gia_ManCo(pCof0,Ctrl);
            bVar6 = _n != (Gia_Obj_t *)0x0;
          }
          if (!bVar6) break;
          pGVar4 = Gia_ManCi(pCof0,iVar);
          iCtrl = pGVar4->Value;
          pGVar4 = Gia_ManCo(pGia[0],Ctrl);
          iVar1 = Gia_ObjFanin0Copy(pGVar4);
          iVar2 = Gia_ObjFanin0Copy(_n);
          iVar1 = Gia_ManHashMux(p,iCtrl,iVar1,iVar2);
          Gia_ManAppendCo(p,iVar1);
          Ctrl = Ctrl + 1;
        }
        pGVar5 = Gia_ManCleanup(p);
        Gia_ManStop(p);
        return pGVar5;
      }
    }
    __assert_fail("iVar >= 0 && iVar < Gia_ManCiNum(pCof1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x66b,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  __assert_fail("Gia_ManCoNum(pCof1) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x669,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupMux( int iVar, Gia_Man_t * pCof1, Gia_Man_t * pCof0 )
{
    Gia_Man_t * pGia[2] = {pCof0, pCof1};
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, n;
    assert( Gia_ManRegNum(pCof0) == 0 );
    assert( Gia_ManRegNum(pCof1) == 0 );
    assert( Gia_ManCoNum(pCof0) == 1 );
    assert( Gia_ManCoNum(pCof1) == 1 );
    assert( Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0) );
    assert( iVar >= 0 && iVar < Gia_ManCiNum(pCof1) );
    pNew = Gia_ManStart( Gia_ManObjNum(pCof1) + Gia_ManObjNum(pCof0) );
    pNew->pName = Abc_UtilStrsav( pCof1->pName );
    pNew->pSpec = Abc_UtilStrsav( pCof1->pSpec );
    Gia_ManHashAlloc( pNew );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFillValue( pGia[n] );
        Gia_ManConst0(pGia[n])->Value = 0;
        Gia_ManForEachCi( pGia[n], pObj, i )
            pObj->Value = n ? Gia_ManCi(pGia[0], i)->Value : Gia_ManAppendCi(pNew);
        Gia_ManForEachCo( pGia[n], pObj, i )
            Gia_ManDupCofactorVar_rec( pNew, pGia[n], Gia_ObjFanin0(pObj) );
    }
    Gia_ManForEachCo( pGia[0], pObj, i )
    {
        int Ctrl = Gia_ManCi(pGia[0], iVar)->Value;
        int Lit1 = Gia_ObjFanin0Copy(Gia_ManCo(pGia[1], i));
        int Lit0 = Gia_ObjFanin0Copy(pObj);
        Gia_ManAppendCo( pNew, Gia_ManHashMux( pNew, Ctrl, Lit1, Lit0 ) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}